

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryResolution.hpp
# Opt level: O2

Option<Kernel::Clause_*> __thiscall
Inferences::ALASCA::BinaryResolutionConf::applyRule_
          (BinaryResolutionConf *this,SelectedLiteral *lhs,uint lhsVarBank,SelectedLiteral *rhs,
          uint rhsVarBank,AbstractingUnifier *uwa)

{
  undefined8 *puVar1;
  Clause *pCVar2;
  undefined4 in_register_00000014;
  MaybeUninit<Kernel::Clause_*> extraout_RDX;
  undefined4 in_register_00000084;
  undefined8 *puVar3;
  Option<Kernel::Clause_*> OVar4;
  AbstractingUnifier *in_stack_00000008;
  
  puVar3 = (undefined8 *)CONCAT44(in_register_00000084,rhsVarBank);
  puVar1 = (undefined8 *)CONCAT44(in_register_00000014,lhsVarBank);
  if ((int)rhs == 0) {
    puVar3 = (undefined8 *)CONCAT44(in_register_00000014,lhsVarBank);
    puVar1 = (undefined8 *)CONCAT44(in_register_00000084,rhsVarBank);
  }
  pCVar2 = Inferences::BinaryResolution::generateClause
                     ((Clause *)*puVar3,((Clause *)*puVar3)->_literals[*(int *)(puVar3 + 1)],
                      (Clause *)*puVar1,((Clause *)*puVar1)->_literals[*(int *)(puVar1 + 1)],
                      in_stack_00000008,Lib::env,
                      *(SaturationAlgorithm **)
                       &(lhs->interpreted).
                        super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                        ._elem._elem);
  if (pCVar2 == (Clause *)0x0) {
    (this->_shared).super___shared_ptr<Kernel::AlascaState,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (this->_shared).super___shared_ptr<Kernel::AlascaState,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    (this->_shared).super___shared_ptr<Kernel::AlascaState,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pCVar2;
  }
  *(bool *)&(this->_shared).super___shared_ptr<Kernel::AlascaState,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = pCVar2 != (Clause *)0x0;
  OVar4.super_OptionBase<Kernel::Clause_*>._elem._elem = extraout_RDX._elem;
  OVar4.super_OptionBase<Kernel::Clause_*>._0_8_ = this;
  return (Option<Kernel::Clause_*>)OVar4.super_OptionBase<Kernel::Clause_*>;
}

Assistant:

Option<Clause*> applyRule_(
      SelectedLiteral const* lhs, unsigned lhsVarBank,
      SelectedLiteral const* rhs, unsigned rhsVarBank,
      AbstractingUnifier& uwa
      ) const {
    if (lhsVarBank != subsTreeQueryBank(0)) {
      ASS_EQ(rhsVarBank, subsTreeQueryBank(0))
      std::swap(lhs, rhs);
      std::swap(lhsVarBank, rhsVarBank);
    }
    ASS(_salg)
    auto res = Inferences::BinaryResolution::generateClause(
        lhs->clause(), lhs->literal(), 
        rhs->clause(), rhs->literal(),
        uwa, *env.options, _salg);
    return res == nullptr ? Option<Clause*>() : some(res);
  }